

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_tree_parse(mpack_tree_t *tree)

{
  byte bVar1;
  char *__dest;
  _Bool _Var2;
  mpack_tree_page_t *pmVar3;
  anon_union_8_7_c87e5bf0_for_value aVar4;
  size_t sVar5;
  size_t *psVar6;
  size_t sVar7;
  mpack_node_data_t *node;
  bool bVar8;
  mpack_tree_parser_t parser;
  mpack_tree_parser_t local_f8;
  mpack_level_t stack_local [8];
  
  if (tree->error != mpack_ok) {
    return;
  }
  tree->parsed = true;
  mpack_tree_cleanup(tree);
  local_f8.possible_nodes_left = tree->size;
  if (local_f8.possible_nodes_left == 0) {
    local_f8.possible_nodes_left = tree->data_length;
  }
  else {
    __dest = tree->buffer;
    if (__dest == (char *)0x0) {
      tree->data = tree->data + local_f8.possible_nodes_left;
    }
    else {
      memmove(__dest,__dest + local_f8.possible_nodes_left,
              tree->data_length - local_f8.possible_nodes_left);
      local_f8.possible_nodes_left = tree->size;
    }
    local_f8.possible_nodes_left = tree->data_length - local_f8.possible_nodes_left;
    tree->data_length = local_f8.possible_nodes_left;
    tree->size = 0;
  }
  local_f8.stack = (mpack_level_t *)0x0;
  local_f8._56_8_ = 0;
  local_f8.level = 0;
  local_f8.depth = 0;
  local_f8.nodes = (mpack_node_data_t *)0x0;
  local_f8.nodes_left = 0;
  local_f8.tree = tree;
  if (tree->pool == (mpack_node_data_t *)0x0) {
    pmVar3 = (mpack_tree_page_t *)malloc(0xff8);
    if (pmVar3 == (mpack_tree_page_t *)0x0) {
      tree->error = mpack_error_memory;
      return;
    }
    pmVar3->next = (mpack_tree_page_t *)0x0;
    tree->next = pmVar3;
    local_f8.nodes = pmVar3->nodes;
    local_f8.nodes_left = 0xff;
    tree->root = local_f8.nodes;
  }
  else {
    local_f8.nodes_left = tree->pool_count;
    local_f8.nodes = tree->pool;
  }
  if (tree->error == mpack_ok) {
    sVar7 = 1;
    _Var2 = mpack_tree_reserve_bytes(&local_f8,1);
    if (_Var2) {
      tree->root = local_f8.nodes;
      local_f8.nodes_left = local_f8.nodes_left - 1;
      tree->node_count = 1;
      local_f8._56_8_ = local_f8._56_8_ & 0xffffffffffffff00;
      local_f8.depth = 8;
      local_f8.stack = stack_local;
      local_f8.level = 0;
      stack_local[0].child = local_f8.nodes;
      stack_local[0].left = 1;
      node = local_f8.nodes;
      local_f8.nodes = local_f8.nodes + 1;
      do {
        local_f8.stack[local_f8.level].left = sVar7 - 1;
        local_f8.stack[local_f8.level].child = node + 1;
        bVar1 = (local_f8.tree)->data[(local_f8.tree)->size];
        aVar4.i._1_7_ = 0;
        aVar4.b = (_Bool)bVar1;
        (local_f8.tree)->size = (local_f8.tree)->size + 1;
        switch(bVar1 >> 4) {
        case 0:
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
          node->type = mpack_type_uint;
          break;
        case 8:
          node->type = mpack_type_map;
          goto LAB_00107402;
        case 9:
          node->type = mpack_type_array;
LAB_00107402:
          node->len = bVar1 & 0xf;
          mpack_tree_parse_children(&local_f8,node);
          goto LAB_0010737e;
        case 10:
        case 0xb:
          node->type = mpack_type_str;
          node->len = bVar1 & 0x1f;
          mpack_tree_parse_bytes(&local_f8,node);
          goto LAB_0010737e;
        default:
          (*(code *)(&DAT_0010a814 + *(int *)(&DAT_0010a814 + (ulong)(bVar1 - 0xc0) * 4)))();
          return;
        case 0xe:
        case 0xf:
          aVar4 = (anon_union_8_7_c87e5bf0_for_value)(long)(char)bVar1;
          node->type = mpack_type_int;
        }
        node->value = aVar4;
LAB_0010737e:
        if ((local_f8.tree)->error != mpack_ok) {
LAB_00107680:
          if (local_f8.stack_owned != true) {
            return;
          }
          free(local_f8.stack);
          return;
        }
        sVar5 = local_f8.level;
        for (psVar6 = &local_f8.stack[local_f8.level].left; sVar7 = *psVar6, sVar7 == 0;
            psVar6 = psVar6 + -2) {
          bVar8 = sVar5 == 0;
          sVar5 = sVar5 - 1;
          if (bVar8) goto LAB_00107680;
        }
        node = ((mpack_level_t *)(psVar6 + -1))->child;
        local_f8.level = sVar5;
      } while( true );
    }
  }
  return;
}

Assistant:

void mpack_tree_parse(mpack_tree_t* tree) {
    if (mpack_tree_error(tree) != mpack_ok)
        return;
    tree->parsed = true;

    mpack_tree_cleanup(tree);

    mpack_log("starting parse\n");

    // check if we previously parsed a tree
    if (tree->size > 0) {
        #ifdef MPACK_MALLOC
        // if we're buffered, move the remaining data back to the
        // start of the buffer
        // TODO: shrink buffer?
        if (tree->buffer != NULL) {
            mpack_memmove(tree->buffer, tree->buffer + tree->size, tree->data_length - tree->size);
        }
        else
        #endif
        // otherwise advance past the parsed data
        {
            tree->data += tree->size;
        }
        tree->data_length -= tree->size;
        tree->size = 0;
    }

    // setup parser
    mpack_tree_parser_t parser;
    mpack_tree_parser_setup(&parser, tree);
    if (mpack_tree_error(tree) != mpack_ok)
        return;

    // allocate the root node
    if (!mpack_tree_reserve_bytes(&parser, sizeof(uint8_t)))
        return;
    tree->root = parser.nodes;
    ++parser.nodes;
    --parser.nodes_left;
    tree->node_count = 1;

    // We read nodes in a loop instead of recursively for maximum
    // performance. The stack holds the amount of children left to
    // read in each level of the tree.

    // Even when we have a malloc() function, it's much faster to
    // allocate the initial parsing stack on the call stack. We
    // replace it with a heap allocation if we need to grow it.
    #ifdef MPACK_MALLOC
    #define MPACK_NODE_STACK_LOCAL_DEPTH MPACK_NODE_INITIAL_DEPTH
    parser.stack_owned = false;
    #else
    #define MPACK_NODE_STACK_LOCAL_DEPTH MPACK_NODE_MAX_DEPTH_WITHOUT_MALLOC
    #endif
    mpack_level_t stack_local[MPACK_NODE_STACK_LOCAL_DEPTH]; // no VLAs in VS 2013
    parser.depth = MPACK_NODE_STACK_LOCAL_DEPTH;
    parser.stack = stack_local;
    #undef MPACK_NODE_STACK_LOCAL_DEPTH
    parser.level = 0;
    parser.stack[0].child = tree->root;
    parser.stack[0].left = 1;

    mpack_tree_parse_elements(&parser);

    #ifdef MPACK_MALLOC
    if (parser.stack_owned)
        MPACK_FREE(parser.stack);
    #endif

    if (mpack_tree_error(tree) == mpack_ok) {
        mpack_log("parsed tree of %i bytes, %i bytes left\n", (int)tree->size, (int)parser.possible_nodes_left);
        mpack_log("%i nodes in final page\n", (int)parser.nodes_left);
    }
}